

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::passLinearObjectives
          (Highs *this,HighsInt num_linear_objective,HighsLinearObjective *linear_objective)

{
  ulong uVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  ulong uVar4;
  HighsLinearObjective *linear_objective_00;
  
  HVar3 = kOk;
  if (-1 < num_linear_objective) {
    std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::clear
              (&this->multi_linear_objective_);
    HVar3 = kOk;
    if (num_linear_objective != 0) {
      HVar2 = addLinearObjective(this,linear_objective,0);
      HVar3 = kError;
      if (HVar2 == kOk) {
        linear_objective_00 = linear_objective + 1;
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if ((uint)num_linear_objective == uVar4) break;
          HVar3 = addLinearObjective(this,linear_objective_00,(HighsInt)uVar4);
          linear_objective_00 = linear_objective_00 + 1;
          uVar1 = uVar4 + 1;
        } while (HVar3 == kOk);
        HVar3 = -(uint)(uVar4 < (uint)num_linear_objective);
      }
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::passLinearObjectives(
    const HighsInt num_linear_objective,
    const HighsLinearObjective* linear_objective) {
  if (num_linear_objective < 0) return HighsStatus::kOk;
  this->multi_linear_objective_.clear();
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    if (this->addLinearObjective(linear_objective[iObj], iObj) !=
        HighsStatus::kOk)
      return HighsStatus::kError;
  return HighsStatus::kOk;
}